

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

bool __thiscall pbrt::syntactic::ParamSet::hasParamTexture(ParamSet *this,string *name)

{
  bool bVar1;
  string *unaff_retaddr;
  ParamSet *in_stack_00000008;
  __shared_ptr local_20 [32];
  
  findParam<pbrt::syntactic::Texture>(in_stack_00000008,unaff_retaddr);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  std::shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_> *)0x1aeeda);
  return bVar1;
}

Assistant:

bool hasParamTexture(const std::string &name) const {
        return (bool)findParam<Texture>(name);
      }